

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

void absl::lts_20250127::debugging_internal::MaybeAppendWithLength
               (State *state,char *str,size_t length)

{
  int iVar1;
  
  if ((length != 0) && (*(int *)&(state->parse_state).field_0xc < 0)) {
    if (*str == '<') {
      iVar1 = (state->parse_state).out_cur_idx;
      if (((0 < (long)iVar1) && (iVar1 < state->out_end_idx)) &&
         (state->out[(long)iVar1 + -1] == '<')) {
        Append(state," ",1);
      }
    }
    iVar1 = (state->parse_state).out_cur_idx;
    if ((iVar1 < state->out_end_idx) && ((*str == 0x5f || ((byte)((*str & 0xdfU) + 0xbf) < 0x1a))))
    {
      (state->parse_state).prev_name_idx = iVar1;
      *(short *)&(state->parse_state).field_0xc = (short)length;
    }
    Append(state,str,length);
    return;
  }
  return;
}

Assistant:

static void MaybeAppendWithLength(State *state, const char *const str,
                                  const size_t length) {
  if (state->parse_state.append && length > 0) {
    // Append a space if the output buffer ends with '<' and "str"
    // starts with '<' to avoid <<<.
    if (str[0] == '<' && EndsWith(state, '<')) {
      Append(state, " ", 1);
    }
    // Remember the last identifier name for ctors/dtors,
    // but only if we haven't yet overflown the buffer.
    if (state->parse_state.out_cur_idx < state->out_end_idx &&
        (IsAlpha(str[0]) || str[0] == '_')) {
      state->parse_state.prev_name_idx = state->parse_state.out_cur_idx;
      state->parse_state.prev_name_length = static_cast<unsigned int>(length);
    }
    Append(state, str, length);
  }
}